

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ec_pubkey_create(secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *seckey)

{
  ulong uVar1;
  uchar *puVar2;
  uchar *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  char cVar7;
  long lVar8;
  uchar *p_1;
  uint uVar9;
  bool bVar10;
  uint uVar11;
  undefined1 auVar12 [16];
  secp256k1_gej pj;
  secp256k1_ge p;
  secp256k1_scalar local_128;
  secp256k1_gej local_108;
  secp256k1_ge local_88;
  
  pubkey->data[0x30] = '\0';
  pubkey->data[0x31] = '\0';
  pubkey->data[0x32] = '\0';
  pubkey->data[0x33] = '\0';
  pubkey->data[0x34] = '\0';
  pubkey->data[0x35] = '\0';
  pubkey->data[0x36] = '\0';
  pubkey->data[0x37] = '\0';
  pubkey->data[0x38] = '\0';
  pubkey->data[0x39] = '\0';
  pubkey->data[0x3a] = '\0';
  pubkey->data[0x3b] = '\0';
  pubkey->data[0x3c] = '\0';
  pubkey->data[0x3d] = '\0';
  pubkey->data[0x3e] = '\0';
  pubkey->data[0x3f] = '\0';
  pubkey->data[0x20] = '\0';
  pubkey->data[0x21] = '\0';
  pubkey->data[0x22] = '\0';
  pubkey->data[0x23] = '\0';
  pubkey->data[0x24] = '\0';
  pubkey->data[0x25] = '\0';
  pubkey->data[0x26] = '\0';
  pubkey->data[0x27] = '\0';
  pubkey->data[0x28] = '\0';
  pubkey->data[0x29] = '\0';
  pubkey->data[0x2a] = '\0';
  pubkey->data[0x2b] = '\0';
  pubkey->data[0x2c] = '\0';
  pubkey->data[0x2d] = '\0';
  pubkey->data[0x2e] = '\0';
  pubkey->data[0x2f] = '\0';
  pubkey->data[0x10] = '\0';
  pubkey->data[0x11] = '\0';
  pubkey->data[0x12] = '\0';
  pubkey->data[0x13] = '\0';
  pubkey->data[0x14] = '\0';
  pubkey->data[0x15] = '\0';
  pubkey->data[0x16] = '\0';
  pubkey->data[0x17] = '\0';
  pubkey->data[0x18] = '\0';
  pubkey->data[0x19] = '\0';
  pubkey->data[0x1a] = '\0';
  pubkey->data[0x1b] = '\0';
  pubkey->data[0x1c] = '\0';
  pubkey->data[0x1d] = '\0';
  pubkey->data[0x1e] = '\0';
  pubkey->data[0x1f] = '\0';
  pubkey->data[0] = '\0';
  pubkey->data[1] = '\0';
  pubkey->data[2] = '\0';
  pubkey->data[3] = '\0';
  pubkey->data[4] = '\0';
  pubkey->data[5] = '\0';
  pubkey->data[6] = '\0';
  pubkey->data[7] = '\0';
  pubkey->data[8] = '\0';
  pubkey->data[9] = '\0';
  pubkey->data[10] = '\0';
  pubkey->data[0xb] = '\0';
  pubkey->data[0xc] = '\0';
  pubkey->data[0xd] = '\0';
  pubkey->data[0xe] = '\0';
  pubkey->data[0xf] = '\0';
  if ((ctx->ecmult_gen_ctx).prec == (secp256k1_ge_storage (*) [64] [16])0x0) {
    secp256k1_ec_pubkey_create_cold_1();
    uVar9 = 0;
  }
  else {
    secp256k1_scalar_set_b32(&local_128,seckey,(int *)&local_108);
    bVar10 = ((local_128.d[2] != 0 || local_128.d[3] != 0) ||
             (local_128.d[1] != 0 || local_128.d[0] != 0)) && (int)local_108.x.n[0] == 0;
    uVar9 = (uint)bVar10;
    uVar11 = bVar10 ^ 1;
    uVar1 = (ulong)uVar11 - 1;
    local_128.d[0] = local_128.d[0] & uVar1 | (ulong)uVar11;
    local_128.d[1] = local_128.d[1] & uVar1;
    local_128.d[2] = local_128.d[2] & uVar1;
    local_128.d[3] = uVar1 & local_128.d[3];
    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,&local_108,&local_128);
    secp256k1_ge_set_gej(&local_88,&local_108);
    secp256k1_ge_to_storage((secp256k1_ge_storage *)&local_108,&local_88);
    *(uint64_t *)(pubkey->data + 0x30) = local_108.y.n[1];
    *(uint64_t *)(pubkey->data + 0x38) = local_108.y.n[2];
    *(uint64_t *)(pubkey->data + 0x20) = local_108.x.n[4];
    *(uint64_t *)(pubkey->data + 0x28) = local_108.y.n[0];
    *(uint64_t *)(pubkey->data + 0x10) = local_108.x.n[2];
    *(uint64_t *)(pubkey->data + 0x18) = local_108.x.n[3];
    *(ulong *)pubkey->data = CONCAT44(local_108.x.n[0]._4_4_,(int)local_108.x.n[0]);
    *(uint64_t *)(pubkey->data + 8) = local_108.x.n[1];
    cVar7 = (char)uVar11 + -1;
    auVar12 = ZEXT216(CONCAT11(cVar7,cVar7));
    auVar12 = pshuflw(auVar12,auVar12,0);
    uVar11 = auVar12._0_4_;
    lVar8 = 0;
    do {
      puVar2 = pubkey->data + lVar8;
      uVar4 = *(uint *)(puVar2 + 4);
      uVar5 = *(uint *)(puVar2 + 8);
      uVar6 = *(uint *)(puVar2 + 0xc);
      puVar3 = pubkey->data + lVar8;
      *(uint *)puVar3 = *(uint *)puVar2 & uVar11;
      *(uint *)(puVar3 + 4) = uVar4 & uVar11;
      *(uint *)(puVar3 + 8) = uVar5 & uVar11;
      *(uint *)(puVar3 + 0xc) = uVar6 & uVar11;
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x40);
  }
  return uVar9;
}

Assistant:

int secp256k1_ec_pubkey_create(const secp256k1_context* ctx, secp256k1_pubkey *pubkey, const unsigned char *seckey) {
    secp256k1_ge p;
    secp256k1_scalar seckey_scalar;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    memset(pubkey, 0, sizeof(*pubkey));
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_ec_pubkey_create_helper(&ctx->ecmult_gen_ctx, &seckey_scalar, &p, seckey);
    secp256k1_pubkey_save(pubkey, &p);
    memczero(pubkey, sizeof(*pubkey), !ret);

    secp256k1_scalar_clear(&seckey_scalar);
    return ret;
}